

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

void __thiscall argagg::fmt_ostream::~fmt_ostream(fmt_ostream *this,void **vtt)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  string local_58;
  string local_38;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = pp_Var1;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[5];
  poVar2 = *(ostream **)
            &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x70;
  std::__cxx11::stringbuf::str();
  fmt_string(&local_58,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

inline
fmt_ostream::~fmt_ostream()
{
  output << fmt_string(this->str());
}